

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalNinjaGenerator.cxx
# Opt level: O3

optional<(anonymous_namespace)::cmSourceInfo> *
anon_unknown.dwarf_12b0e41::cmcmd_cmake_ninja_depends_fortran
          (optional<(anonymous_namespace)::cmSourceInfo> *__return_storage_ptr__,string *arg_tdi,
          string *arg_pp)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  size_type sVar3;
  _Storage<(anonymous_namespace)::cmSourceInfo,_false> *p_Var4;
  _Optional_payload_base<(anonymous_namespace)::cmSourceInfo> *p_Var5;
  bool bVar6;
  int iVar7;
  Value *pVVar8;
  _Base_ptr p_Var9;
  const_iterator cVar10;
  _Elt_pointer pEVar11;
  _Rb_tree_node_base *p_Var12;
  optional<(anonymous_namespace)::cmSourceInfo> *extraout_RAX;
  optional<(anonymous_namespace)::cmSourceInfo> *poVar13;
  vector<cmSourceReqInfo,std::allocator<cmSourceReqInfo>> *this;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_00;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_01;
  const_iterator cVar14;
  basic_string_view<char,_std::char_traits<char>_> __str;
  basic_string_view<char,_std::char_traits<char>_> __str_00;
  basic_string_view<char,_std::char_traits<char>_> __str_01;
  string mod;
  string dir_top_bld;
  string module_dir;
  cmSourceReqInfo src_info;
  cmFortranCompiler fc;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  defines;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  includes;
  cmFortranSourceInfo finfo;
  cmFortranParser parser;
  string local_5b8;
  _Optional_payload_base<(anonymous_namespace)::cmSourceInfo> *local_590;
  undefined1 local_588 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_568;
  undefined1 local_558 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_548;
  undefined1 local_538 [16];
  undefined1 local_528 [8];
  char *local_520;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_518;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_508;
  undefined1 local_4f8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_4e8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_4d8;
  pointer local_4c8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  vStack_4c0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_4a8;
  undefined1 local_498 [32];
  undefined1 local_478 [16];
  string local_468 [16];
  undefined1 local_458 [16];
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_448;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_418;
  vector<cmSourceReqInfo,std::allocator<cmSourceReqInfo>> *local_3f8;
  undefined1 local_3f0 [32];
  _Alloc_hider local_3d0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_3c0;
  _Alloc_hider local_3b0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_3a0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_390;
  undefined1 local_378 [8];
  size_t local_370;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_368;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_358;
  undefined1 local_328 [16];
  _Elt_pointer local_318;
  _Elt_pointer local_310;
  _Elt_pointer local_308;
  _Map_pointer local_300;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_2f8;
  undefined1 local_2c8 [16];
  _Base_ptr local_2b8;
  _Rb_tree_node_base *local_2b0;
  _Rb_tree_node_base *local_2a8;
  Location local_2a0;
  _Alloc_hider local_290;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_280;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_268;
  cmFortranParser_s local_238;
  
  (__return_storage_ptr__->super__Optional_base<(anonymous_namespace)::cmSourceInfo,_false,_false>).
  _M_payload.super__Optional_payload<(anonymous_namespace)::cmSourceInfo,_true,_false,_false>.
  super__Optional_payload_base<(anonymous_namespace)::cmSourceInfo>._M_engaged = false;
  local_4a8._M_allocated_capacity = (size_type)local_498;
  local_4a8._8_8_ = 0;
  local_498[0] = 0;
  local_498._16_8_ = local_478;
  local_498._24_8_ = 0;
  local_478[0] = 0;
  local_468._0_8_ = local_458;
  local_468._8_8_ = (pointer)0x0;
  local_458[0] = 0;
  local_418.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_418.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_418.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_568._M_allocated_capacity = (size_type)local_558;
  local_568._8_8_ = (pointer)0x0;
  local_558[0] = 0;
  local_548._M_allocated_capacity = (size_type)local_538;
  local_548._8_8_ = (pointer)0x0;
  local_538[0] = 0;
  local_590 = (_Optional_payload_base<(anonymous_namespace)::cmSourceInfo> *)__return_storage_ptr__;
  Json::Value::Value((Value *)&local_448,nullValue);
  std::ifstream::ifstream(&local_238,(arg_tdi->_M_dataplus)._M_p,_S_in|_S_bin);
  Json::Reader::Reader((Reader *)local_378);
  bVar6 = Json::Reader::parse((Reader *)local_378,(istream *)&local_238,(Value *)&local_448,false);
  if (!bVar6) {
    pcVar2 = (arg_tdi->_M_dataplus)._M_p;
    sVar3 = arg_tdi->_M_string_length;
    Json::Reader::getFormattedErrorMessages_abi_cxx11_((String *)local_588,(Reader *)local_378);
    local_528 = (undefined1  [8])&DAT_00000027;
    local_520 = "-E cmake_ninja_depends failed to parse ";
    local_508._M_allocated_capacity = local_588._8_8_;
    local_508._8_8_ = local_588._0_8_;
    views._M_len = 3;
    views._M_array = (iterator)local_528;
    local_518._M_allocated_capacity = sVar3;
    local_518._8_8_ = pcVar2;
    cmCatViews_abi_cxx11_(&local_5b8,views);
    cmSystemTools::Error(&local_5b8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_5b8._M_dataplus._M_p != &local_5b8.field_2) {
      operator_delete(local_5b8._M_dataplus._M_p,
                      (ulong)(local_5b8.field_2._M_allocated_capacity + 1));
    }
    if ((pointer)local_588._0_8_ != (pointer)(local_588 + 0x10)) {
      operator_delete((void *)local_588._0_8_,local_588._16_8_ + 1);
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_290._M_p != &local_280) {
    operator_delete(local_290._M_p,local_280._M_allocated_capacity + 1);
  }
  if (local_2f8._M_impl.super__Rb_tree_header._M_header._M_right != (_Base_ptr)local_2c8) {
    operator_delete(local_2f8._M_impl.super__Rb_tree_header._M_header._M_right,local_2c8._0_8_ + 1);
  }
  std::deque<Json::Reader::ErrorInfo,_std::allocator<Json::Reader::ErrorInfo>_>::~deque
            ((deque<Json::Reader::ErrorInfo,_std::allocator<Json::Reader::ErrorInfo>_> *)local_328);
  std::_Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>::~_Deque_base
            ((_Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_> *)local_378);
  std::ifstream::~ifstream(&local_238);
  if (bVar6) {
    pVVar8 = Json::Value::operator[]((Value *)&local_448,"dir-top-bld");
    Json::Value::asString_abi_cxx11_((String *)&local_238,pVVar8);
    std::__cxx11::string::operator=((string *)local_568._M_local_buf,(string *)&local_238);
    paVar1 = &local_238.Compiler.Id.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_238.Compiler.Id._M_dataplus._M_p != paVar1) {
      operator_delete(local_238.Compiler.Id._M_dataplus._M_p,
                      local_238.Compiler.Id.field_2._M_allocated_capacity + 1);
    }
    if ((pointer)local_568._8_8_ != (pointer)0x0) {
      local_238.Compiler.Id._M_dataplus._M_p = (pointer)local_568._8_8_;
      local_238.Compiler.Id._M_string_length = local_568._M_allocated_capacity;
      __str._M_str = "/";
      __str._M_len = 1;
      iVar7 = std::basic_string_view<char,_std::char_traits<char>_>::compare
                        ((basic_string_view<char,_std::char_traits<char>_> *)&local_238,
                         (size_type)(local_568._8_8_ + -1),1,__str);
      if (iVar7 != 0) {
        std::__cxx11::string::push_back((char)&local_568);
      }
    }
    pVVar8 = Json::Value::operator[]((Value *)&local_448,"include-dirs");
    bVar6 = Json::Value::isArray(pVVar8);
    if (bVar6) {
      cVar14 = Json::Value::begin(pVVar8);
      local_378 = (undefined1  [8])cVar14.super_ValueIteratorBase.current_._M_node;
      local_370 = CONCAT71(local_370._1_7_,cVar14.super_ValueIteratorBase.isNull_);
      cVar14 = Json::Value::end(pVVar8);
      local_528 = (undefined1  [8])cVar14.super_ValueIteratorBase.current_._M_node;
      local_520 = (char *)CONCAT71(local_520._1_7_,cVar14.super_ValueIteratorBase.isNull_);
      while (bVar6 = Json::ValueIteratorBase::isEqual
                               ((ValueIteratorBase *)local_378,(SelfType *)local_528), !bVar6) {
        pVVar8 = Json::ValueIteratorBase::deref((ValueIteratorBase *)local_378);
        Json::Value::asString_abi_cxx11_((String *)&local_238,pVVar8);
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_418,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_238);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_238.Compiler.Id._M_dataplus._M_p != paVar1) {
          operator_delete(local_238.Compiler.Id._M_dataplus._M_p,
                          local_238.Compiler.Id.field_2._M_allocated_capacity + 1);
        }
        Json::ValueIteratorBase::increment((ValueIteratorBase *)local_378);
      }
    }
    pVVar8 = Json::Value::operator[]((Value *)&local_448,"module-dir");
    Json::Value::asString_abi_cxx11_((String *)&local_238,pVVar8);
    std::__cxx11::string::operator=((string *)(local_558 + 0x10),(string *)&local_238);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_238.Compiler.Id._M_dataplus._M_p != paVar1) {
      operator_delete(local_238.Compiler.Id._M_dataplus._M_p,
                      local_238.Compiler.Id.field_2._M_allocated_capacity + 1);
    }
    if ((pointer)local_548._8_8_ != (pointer)0x0) {
      local_238.Compiler.Id._M_dataplus._M_p = (pointer)local_548._8_8_;
      local_238.Compiler.Id._M_string_length = local_548._M_allocated_capacity;
      __str_00._M_str = "/";
      __str_00._M_len = 1;
      iVar7 = std::basic_string_view<char,_std::char_traits<char>_>::compare
                        ((basic_string_view<char,_std::char_traits<char>_> *)&local_238,
                         (size_type)(local_548._8_8_ - 1),1,__str_00);
      if (iVar7 != 0) {
        std::__cxx11::string::push_back((char)local_558 + '\x10');
      }
    }
    pVVar8 = Json::Value::operator[]((Value *)&local_448,"compiler-id");
    Json::Value::asString_abi_cxx11_((String *)&local_238,pVVar8);
    std::__cxx11::string::operator=((string *)local_4a8._M_local_buf,(string *)&local_238);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_238.Compiler.Id._M_dataplus._M_p != paVar1) {
      operator_delete(local_238.Compiler.Id._M_dataplus._M_p,
                      local_238.Compiler.Id.field_2._M_allocated_capacity + 1);
    }
    pVVar8 = Json::Value::operator[]((Value *)&local_448,"submodule-sep");
    Json::Value::asString_abi_cxx11_((String *)&local_238,pVVar8);
    std::__cxx11::string::operator=((string *)(local_498 + 0x10),(string *)&local_238);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_238.Compiler.Id._M_dataplus._M_p != paVar1) {
      operator_delete(local_238.Compiler.Id._M_dataplus._M_p,
                      local_238.Compiler.Id.field_2._M_allocated_capacity + 1);
    }
    pVVar8 = Json::Value::operator[]((Value *)&local_448,"submodule-ext");
    Json::Value::asString_abi_cxx11_((String *)&local_238,pVVar8);
    std::__cxx11::string::operator=(local_468,(string *)&local_238);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_238.Compiler.Id._M_dataplus._M_p != paVar1) {
      operator_delete(local_238.Compiler.Id._M_dataplus._M_p,
                      local_238.Compiler.Id.field_2._M_allocated_capacity + 1);
    }
    Json::Value::~Value((Value *)&local_448);
    local_378 = (undefined1  [8])&local_368;
    local_370 = 0;
    local_368._M_local_buf[0] = '\0';
    local_358._M_impl.super__Rb_tree_header._M_header._M_left =
         &local_358._M_impl.super__Rb_tree_header._M_header;
    local_358._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    local_358._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    local_358._M_impl.super__Rb_tree_header._M_node_count = 0;
    local_310 = (_Elt_pointer)(local_328 + 8);
    local_328._8_4_ = _S_red;
    local_318 = (_Elt_pointer)0x0;
    local_300 = (_Map_pointer)0x0;
    local_2f8._M_impl.super__Rb_tree_header._M_header._M_left =
         &local_2f8._M_impl.super__Rb_tree_header._M_header;
    local_2f8._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    local_2f8._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    local_2f8._M_impl.super__Rb_tree_header._M_node_count = 0;
    local_2b0 = (_Rb_tree_node_base *)(local_2c8 + 8);
    local_2c8._8_4_ = 0;
    local_2b8 = (_Base_ptr)0x0;
    local_2a0 = (Location)0x0;
    local_448._M_impl.super__Rb_tree_header._M_header._M_left =
         &local_448._M_impl.super__Rb_tree_header._M_header;
    local_448._M_impl.super__Rb_tree_header._M_header._M_color = 0;
    local_448._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    local_448._M_impl.super__Rb_tree_header._M_node_count = 0;
    local_448._M_impl.super__Rb_tree_header._M_header._M_right =
         local_448._M_impl.super__Rb_tree_header._M_header._M_left;
    local_3f0._0_8_ = local_3f0 + 0x10;
    local_358._M_impl.super__Rb_tree_header._M_header._M_right =
         local_358._M_impl.super__Rb_tree_header._M_header._M_left;
    local_308 = local_310;
    local_2f8._M_impl.super__Rb_tree_header._M_header._M_right =
         local_2f8._M_impl.super__Rb_tree_header._M_header._M_left;
    local_2a8 = local_2b0;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_3f0,local_4a8._M_allocated_capacity,
               local_4a8._8_8_ + local_4a8._M_allocated_capacity);
    local_3d0._M_p = (pointer)&local_3c0;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_3d0,local_498._16_8_,
               (undefined1 *)(local_498._24_8_ + local_498._16_8_));
    local_3b0._M_p = (pointer)&local_3a0;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_3b0,local_468._0_8_,
               (undefined1 *)
               ((long)&(((string *)local_468._8_8_)->_M_dataplus)._M_p + local_468._0_8_));
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector(&local_390,&local_418);
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::_Rb_tree(&local_268,&local_448);
    cmFortranParser_s::cmFortranParser_s
              (&local_238,(cmFortranCompiler *)local_3f0,&local_390,
               (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&local_268,(cmFortranSourceInfo *)local_378);
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~_Rb_tree(&local_268);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_390);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3b0._M_p != &local_3a0) {
      operator_delete(local_3b0._M_p,local_3a0._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3d0._M_p != &local_3c0) {
      operator_delete(local_3d0._M_p,local_3c0._M_allocated_capacity + 1);
    }
    if ((undefined1 *)local_3f0._0_8_ != local_3f0 + 0x10) {
      operator_delete((void *)local_3f0._0_8_,local_3f0._16_8_ + 1);
    }
    bVar6 = cmFortranParser_FilePush(&local_238,(arg_pp->_M_dataplus)._M_p);
    if (bVar6) {
      iVar7 = cmFortran_yyparse(local_238.Scanner);
      p_Var5 = local_590;
      if (iVar7 == 0) {
        local_528 = (undefined1  [8])&local_518;
        local_518._M_allocated_capacity = 0;
        local_518._8_8_ = (pointer)0x0;
        local_520 = (char *)0x0;
        local_508._M_allocated_capacity = 0;
        local_508._8_8_ = (pointer)0x0;
        local_4f8._0_8_ = (pointer)0x0;
        local_4f8._8_8_ = (pointer)0x0;
        local_4e8._M_allocated_capacity = 0;
        local_4e8._8_8_ = (pointer)0x0;
        local_4d8._M_allocated_capacity = 0;
        local_4d8._8_8_ = (pointer)0x0;
        local_4c8 = (pointer)0x0;
        vStack_4c0.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        vStack_4c0.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        vStack_4c0.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        if (local_590->_M_engaged == true) {
          std::__cxx11::string::operator=((string *)local_590,(string *)local_528);
          local_5b8.field_2._M_allocated_capacity =
               (size_type)
               (p_Var5->_M_payload)._M_value.ScanDep.ExtraOutputs.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage;
          (p_Var5->_M_payload)._M_value.ScanDep.ExtraOutputs.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)local_4f8._0_8_;
          local_5b8._M_dataplus._M_p =
               (pointer)(p_Var5->_M_payload)._M_value.ScanDep.ExtraOutputs.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start;
          local_5b8._M_string_length =
               (size_type)
               (p_Var5->_M_payload)._M_value.ScanDep.ExtraOutputs.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
          (p_Var5->_M_payload)._M_value.ScanDep.ExtraOutputs.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)local_508._M_allocated_capacity;
          (p_Var5->_M_payload)._M_value.ScanDep.ExtraOutputs.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish = (pointer)local_508._8_8_;
          local_4f8._0_8_ = (pointer)0x0;
          local_508._M_allocated_capacity = 0;
          local_508._8_8_ = (pointer)0x0;
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&local_5b8);
          local_5b8.field_2._M_allocated_capacity =
               (size_type)
               (p_Var5->_M_payload)._M_value.ScanDep.Provides.
               super__Vector_base<cmSourceReqInfo,_std::allocator<cmSourceReqInfo>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage;
          (p_Var5->_M_payload)._M_value.ScanDep.Provides.
          super__Vector_base<cmSourceReqInfo,_std::allocator<cmSourceReqInfo>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)local_4e8._8_8_;
          local_5b8._M_dataplus._M_p =
               (pointer)(p_Var5->_M_payload)._M_value.ScanDep.Provides.
                        super__Vector_base<cmSourceReqInfo,_std::allocator<cmSourceReqInfo>_>.
                        _M_impl.super__Vector_impl_data._M_start;
          local_5b8._M_string_length =
               (size_type)
               (p_Var5->_M_payload)._M_value.ScanDep.Provides.
               super__Vector_base<cmSourceReqInfo,_std::allocator<cmSourceReqInfo>_>._M_impl.
               super__Vector_impl_data._M_finish;
          (p_Var5->_M_payload)._M_value.ScanDep.Provides.
          super__Vector_base<cmSourceReqInfo,_std::allocator<cmSourceReqInfo>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)local_4f8._8_8_;
          (p_Var5->_M_payload)._M_value.ScanDep.Provides.
          super__Vector_base<cmSourceReqInfo,_std::allocator<cmSourceReqInfo>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)local_4e8._M_allocated_capacity;
          local_4f8._8_8_ = (pointer)0x0;
          local_4e8._M_allocated_capacity = 0;
          local_4e8._8_8_ = (pointer)0x0;
          std::vector<cmSourceReqInfo,_std::allocator<cmSourceReqInfo>_>::~vector
                    ((vector<cmSourceReqInfo,_std::allocator<cmSourceReqInfo>_> *)&local_5b8);
          local_5b8.field_2._M_allocated_capacity =
               (size_type)
               (p_Var5->_M_payload)._M_value.ScanDep.Requires.
               super__Vector_base<cmSourceReqInfo,_std::allocator<cmSourceReqInfo>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage;
          (p_Var5->_M_payload)._M_value.ScanDep.Requires.
          super__Vector_base<cmSourceReqInfo,_std::allocator<cmSourceReqInfo>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = local_4c8;
          local_5b8._M_dataplus._M_p =
               (pointer)(p_Var5->_M_payload)._M_value.ScanDep.Requires.
                        super__Vector_base<cmSourceReqInfo,_std::allocator<cmSourceReqInfo>_>.
                        _M_impl.super__Vector_impl_data._M_start;
          local_5b8._M_string_length =
               (size_type)
               (p_Var5->_M_payload)._M_value.ScanDep.Requires.
               super__Vector_base<cmSourceReqInfo,_std::allocator<cmSourceReqInfo>_>._M_impl.
               super__Vector_impl_data._M_finish;
          (p_Var5->_M_payload)._M_value.ScanDep.Requires.
          super__Vector_base<cmSourceReqInfo,_std::allocator<cmSourceReqInfo>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)local_4d8._M_allocated_capacity;
          (p_Var5->_M_payload)._M_value.ScanDep.Requires.
          super__Vector_base<cmSourceReqInfo,_std::allocator<cmSourceReqInfo>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)local_4d8._8_8_;
          local_4d8._M_allocated_capacity = 0;
          local_4d8._8_8_ = (pointer)0x0;
          local_4c8 = (pointer)0x0;
          std::vector<cmSourceReqInfo,_std::allocator<cmSourceReqInfo>_>::~vector
                    ((vector<cmSourceReqInfo,_std::allocator<cmSourceReqInfo>_> *)&local_5b8);
          local_5b8.field_2._M_allocated_capacity =
               (size_type)
               (p_Var5->_M_payload)._M_value.Includes.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage;
          (p_Var5->_M_payload)._M_value.Includes.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage =
               vStack_4c0.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage;
          local_5b8._M_dataplus._M_p =
               (pointer)(p_Var5->_M_payload)._M_value.Includes.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start;
          local_5b8._M_string_length =
               (size_type)
               (p_Var5->_M_payload)._M_value.Includes.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
          (p_Var5->_M_payload)._M_value.Includes.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start =
               vStack_4c0.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
          (p_Var5->_M_payload)._M_value.Includes.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish =
               vStack_4c0.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
          vStack_4c0.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          vStack_4c0.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          vStack_4c0.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&local_5b8);
        }
        else {
          std::_Optional_payload_base<(anonymous_namespace)::cmSourceInfo>::
          _M_construct<(anonymous_namespace)::cmSourceInfo>(local_590,(cmSourceInfo *)local_528);
        }
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&vStack_4c0);
        std::vector<cmSourceReqInfo,_std::allocator<cmSourceReqInfo>_>::~vector
                  ((vector<cmSourceReqInfo,_std::allocator<cmSourceReqInfo>_> *)&local_4d8);
        std::vector<cmSourceReqInfo,_std::allocator<cmSourceReqInfo>_>::~vector
                  ((vector<cmSourceReqInfo,_std::allocator<cmSourceReqInfo>_> *)(local_4f8 + 8));
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&local_508);
        if (local_528 != (undefined1  [8])&local_518) {
          operator_delete((void *)local_528,local_518._M_allocated_capacity + 1);
        }
        if ((_Rb_tree_header *)local_358._M_impl.super__Rb_tree_header._M_header._M_left !=
            &local_358._M_impl.super__Rb_tree_header) {
          this = (vector<cmSourceReqInfo,std::allocator<cmSourceReqInfo>> *)
                 &(((_Optional_payload<(anonymous_namespace)::cmSourceInfo,_false,_false,_false> *)
                   &(local_590->_M_payload)._M_value.ScanDep)->
                  super__Optional_payload<(anonymous_namespace)::cmSourceInfo,_true,_false,_false>).
                  super__Optional_payload_base<(anonymous_namespace)::cmSourceInfo>._M_payload.
                  _M_value.ScanDep.Provides;
          p_Var9 = local_358._M_impl.super__Rb_tree_header._M_header._M_left;
          local_3f8 = this;
          do {
            local_528 = (undefined1  [8])&local_518;
            local_520 = (char *)0x0;
            local_518._M_allocated_capacity = local_518._M_allocated_capacity & 0xffffffffffffff00;
            local_508._8_8_ = (pointer)0x0;
            local_4f8._0_8_ = local_4f8._0_8_ & 0xffffffffffffff00;
            local_4e8._8_8_ = (pointer)0x0;
            local_4d8._M_allocated_capacity = local_4d8._M_allocated_capacity & 0xffffffffffffff00;
            local_4c8 = (pointer)CONCAT62(local_4c8._2_6_,0x100);
            local_4c8 = (pointer)((ulong)local_4c8 & 0xffffffff);
            local_508._M_allocated_capacity = (size_type)(pointer)local_4f8;
            local_4e8._M_allocated_capacity = (size_type)&local_4d8;
            std::__cxx11::string::_M_assign((string *)local_528);
            if ((pointer)local_548._8_8_ != (pointer)0x0) {
              local_5b8.field_2._8_8_ = *(undefined8 *)(p_Var9 + 1);
              local_5b8.field_2._M_allocated_capacity = (size_type)p_Var9[1]._M_parent;
              local_5b8._M_dataplus._M_p = (pointer)local_548._8_8_;
              local_5b8._M_string_length = local_548._M_allocated_capacity;
              views_01._M_len = 2;
              views_01._M_array = (iterator)&local_5b8;
              cmCatViews_abi_cxx11_((string *)local_588,views_01);
              if ((pointer)local_568._8_8_ != (pointer)0x0) {
                local_5b8._M_dataplus._M_p = (pointer)local_588._8_8_;
                local_5b8._M_string_length = local_588._0_8_;
                __str_01._M_str = (char *)local_568._M_allocated_capacity;
                __str_01._M_len = local_568._8_8_;
                iVar7 = std::basic_string_view<char,_std::char_traits<char>_>::compare
                                  ((basic_string_view<char,_std::char_traits<char>_> *)&local_5b8,0,
                                   local_568._8_8_,__str_01);
                if (iVar7 == 0) {
                  std::__cxx11::string::substr((ulong)&local_5b8,(ulong)local_588);
                  std::__cxx11::string::operator=((string *)local_588,(string *)&local_5b8);
                  this = local_3f8;
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_5b8._M_dataplus._M_p != &local_5b8.field_2) {
                    operator_delete(local_5b8._M_dataplus._M_p,
                                    (ulong)(local_5b8.field_2._M_allocated_capacity + 1));
                    this = local_3f8;
                  }
                }
              }
              std::__cxx11::string::operator=((string *)local_4e8._M_local_buf,(string *)local_588);
              if ((pointer)local_588._0_8_ != (pointer)(local_588 + 0x10)) {
                operator_delete((void *)local_588._0_8_,local_588._16_8_ + 1);
              }
            }
            std::vector<cmSourceReqInfo,std::allocator<cmSourceReqInfo>>::
            emplace_back<cmSourceReqInfo&>(this,(cmSourceReqInfo *)local_528);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_4e8._M_allocated_capacity != &local_4d8) {
              operator_delete((void *)local_4e8._M_allocated_capacity,
                              (ulong)(local_4d8._M_allocated_capacity + 1));
            }
            if ((pointer)local_508._M_allocated_capacity != (pointer)local_4f8) {
              operator_delete((void *)local_508._M_allocated_capacity,(ulong)(local_4f8._0_8_ + 1));
            }
            if (local_528 != (undefined1  [8])&local_518) {
              operator_delete((void *)local_528,local_518._M_allocated_capacity + 1);
            }
            p_Var9 = (_Base_ptr)std::_Rb_tree_increment(p_Var9);
          } while ((_Rb_tree_header *)p_Var9 != &local_358._M_impl.super__Rb_tree_header);
        }
        if (local_310 != (_Elt_pointer)(local_328 + 8)) {
          p_Var4 = &local_590->_M_payload;
          pEVar11 = local_310;
          do {
            cVar10 = std::
                     _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ::find(&local_358,(key_type *)&(pEVar11->message_)._M_string_length);
            if ((_Rb_tree_header *)cVar10._M_node == &local_358._M_impl.super__Rb_tree_header) {
              local_528 = (undefined1  [8])&local_518;
              local_520 = (char *)0x0;
              local_518._M_allocated_capacity = local_518._M_allocated_capacity & 0xffffffffffffff00
              ;
              local_508._M_allocated_capacity = (size_type)local_4f8;
              local_508._8_8_ = (pointer)0x0;
              local_4f8._0_8_ = local_4f8._0_8_ & 0xffffffffffffff00;
              local_4e8._8_8_ = (pointer)0x0;
              local_4d8._M_allocated_capacity = local_4d8._M_allocated_capacity & 0xffffffffffffff00
              ;
              local_4c8 = (pointer)CONCAT62(local_4c8._2_6_,0x100);
              local_4c8 = (pointer)((ulong)local_4c8 & 0xffffffff);
              local_4e8._M_allocated_capacity = (size_type)&local_4d8;
              std::__cxx11::string::_M_assign((string *)local_528);
              std::vector<cmSourceReqInfo,std::allocator<cmSourceReqInfo>>::
              emplace_back<cmSourceReqInfo&>
                        ((vector<cmSourceReqInfo,std::allocator<cmSourceReqInfo>> *)
                         &(((_Optional_payload<(anonymous_namespace)::cmSourceInfo,_false,_false,_false>
                             *)&(p_Var4->_M_value).ScanDep)->
                          super__Optional_payload<(anonymous_namespace)::cmSourceInfo,_true,_false,_false>
                          ).super__Optional_payload_base<(anonymous_namespace)::cmSourceInfo>.
                          _M_payload._M_value.ScanDep.Requires,(cmSourceReqInfo *)local_528);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_4e8._M_allocated_capacity != &local_4d8) {
                operator_delete((void *)local_4e8._M_allocated_capacity,
                                (ulong)(local_4d8._M_allocated_capacity + 1));
              }
              if ((pointer)local_508._M_allocated_capacity != (pointer)local_4f8) {
                operator_delete((void *)local_508._M_allocated_capacity,(ulong)(local_4f8._0_8_ + 1)
                               );
              }
              if (local_528 != (undefined1  [8])&local_518) {
                operator_delete((void *)local_528,local_518._M_allocated_capacity + 1);
              }
            }
            pEVar11 = (_Elt_pointer)std::_Rb_tree_increment((_Rb_tree_node_base *)pEVar11);
          } while (pEVar11 != (_Elt_pointer)(local_328 + 8));
        }
        if (local_2b0 != (_Rb_tree_node_base *)(local_2c8 + 8)) {
          p_Var4 = &local_590->_M_payload;
          p_Var12 = local_2b0;
          do {
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::push_back(&(p_Var4->_M_value).Includes,(value_type *)(p_Var12 + 1));
            p_Var12 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var12);
          } while (p_Var12 != (_Rb_tree_node_base *)(local_2c8 + 8));
        }
      }
    }
    else {
      local_518._8_8_ = (arg_pp->_M_dataplus)._M_p;
      local_518._M_allocated_capacity = arg_pp->_M_string_length;
      local_528 = (undefined1  [8])0x26;
      local_520 = "-E cmake_ninja_depends failed to open ";
      views_00._M_len = 2;
      views_00._M_array = (iterator)local_528;
      cmCatViews_abi_cxx11_(&local_5b8,views_00);
      cmSystemTools::Error(&local_5b8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_5b8._M_dataplus._M_p != &local_5b8.field_2) {
        operator_delete(local_5b8._M_dataplus._M_p,
                        (ulong)(local_5b8.field_2._M_allocated_capacity + 1));
      }
    }
    cmFortranParser_s::~cmFortranParser_s(&local_238);
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~_Rb_tree(&local_448);
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_2c8);
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~_Rb_tree(&local_2f8);
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_328);
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~_Rb_tree(&local_358);
    if (local_378 != (undefined1  [8])&local_368) {
      operator_delete((void *)local_378,
                      CONCAT71(local_368._M_allocated_capacity._1_7_,local_368._M_local_buf[0]) + 1)
      ;
    }
  }
  else {
    Json::Value::~Value((Value *)&local_448);
  }
  if ((pointer)local_548._M_allocated_capacity != (pointer)local_538) {
    operator_delete((void *)local_548._M_allocated_capacity,
                    CONCAT71(local_538._1_7_,local_538[0]) + 1);
  }
  if ((pointer)local_568._M_allocated_capacity != (pointer)local_558) {
    operator_delete((void *)local_568._M_allocated_capacity,
                    CONCAT71(local_558._1_7_,local_558[0]) + 1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_418);
  if ((pointer)local_468._0_8_ != (pointer)local_458) {
    operator_delete((void *)local_468._0_8_,CONCAT71(local_458._1_7_,local_458[0]) + 1);
  }
  if ((undefined1 *)local_498._16_8_ != local_478) {
    operator_delete((void *)local_498._16_8_,CONCAT71(local_478._1_7_,local_478[0]) + 1);
  }
  poVar13 = (optional<(anonymous_namespace)::cmSourceInfo> *)local_498;
  if ((optional<(anonymous_namespace)::cmSourceInfo> *)local_4a8._M_allocated_capacity != poVar13) {
    operator_delete((void *)local_4a8._M_allocated_capacity,
                    CONCAT71(local_498._1_7_,local_498[0]) + 1);
    poVar13 = extraout_RAX;
  }
  return poVar13;
}

Assistant:

cm::optional<cmSourceInfo> cmcmd_cmake_ninja_depends_fortran(
  std::string const& arg_tdi, std::string const& arg_pp)
{
  cm::optional<cmSourceInfo> info;
  cmFortranCompiler fc;
  std::vector<std::string> includes;
  std::string dir_top_bld;
  std::string module_dir;
  {
    Json::Value tdio;
    Json::Value const& tdi = tdio;
    {
      cmsys::ifstream tdif(arg_tdi.c_str(), std::ios::in | std::ios::binary);
      Json::Reader reader;
      if (!reader.parse(tdif, tdio, false)) {
        cmSystemTools::Error(
          cmStrCat("-E cmake_ninja_depends failed to parse ", arg_tdi,
                   reader.getFormattedErrorMessages()));
        return info;
      }
    }

    dir_top_bld = tdi["dir-top-bld"].asString();
    if (!dir_top_bld.empty() && !cmHasLiteralSuffix(dir_top_bld, "/")) {
      dir_top_bld += '/';
    }

    Json::Value const& tdi_include_dirs = tdi["include-dirs"];
    if (tdi_include_dirs.isArray()) {
      for (auto const& tdi_include_dir : tdi_include_dirs) {
        includes.push_back(tdi_include_dir.asString());
      }
    }

    Json::Value const& tdi_module_dir = tdi["module-dir"];
    module_dir = tdi_module_dir.asString();
    if (!module_dir.empty() && !cmHasLiteralSuffix(module_dir, "/")) {
      module_dir += '/';
    }

    Json::Value const& tdi_compiler_id = tdi["compiler-id"];
    fc.Id = tdi_compiler_id.asString();

    Json::Value const& tdi_submodule_sep = tdi["submodule-sep"];
    fc.SModSep = tdi_submodule_sep.asString();

    Json::Value const& tdi_submodule_ext = tdi["submodule-ext"];
    fc.SModExt = tdi_submodule_ext.asString();
  }

  cmFortranSourceInfo finfo;
  std::set<std::string> defines;
  cmFortranParser parser(fc, includes, defines, finfo);
  if (!cmFortranParser_FilePush(&parser, arg_pp.c_str())) {
    cmSystemTools::Error(
      cmStrCat("-E cmake_ninja_depends failed to open ", arg_pp));
    return info;
  }
  if (cmFortran_yyparse(parser.Scanner) != 0) {
    // Failed to parse the file.
    return info;
  }

  info = cmSourceInfo();
  for (std::string const& provide : finfo.Provides) {
    cmSourceReqInfo src_info;
    src_info.LogicalName = provide;
    if (!module_dir.empty()) {
      std::string mod = cmStrCat(module_dir, provide);
      if (!dir_top_bld.empty() && cmHasPrefix(mod, dir_top_bld)) {
        mod = mod.substr(dir_top_bld.size());
      }
      src_info.CompiledModulePath = std::move(mod);
    }
    info->ScanDep.Provides.emplace_back(src_info);
  }
  for (std::string const& require : finfo.Requires) {
    // Require modules not provided in the same source.
    if (finfo.Provides.count(require)) {
      continue;
    }
    cmSourceReqInfo src_info;
    src_info.LogicalName = require;
    info->ScanDep.Requires.emplace_back(src_info);
  }
  for (std::string const& include : finfo.Includes) {
    info->Includes.push_back(include);
  }
  return info;
}